

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O3

void __thiscall cppwinrt::type_name::type_name(type_name *this,TypeDef *type)

{
  table_base *ptVar1;
  database *pdVar2;
  uint uVar3;
  string_view sVar4;
  
  ptVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  pdVar2 = ptVar1->m_database;
  uVar3 = winmd::reader::table_base::get_value<unsigned_int>
                    (ptVar1,(type->super_row_base<winmd::reader::TypeDef>).m_index,1);
  sVar4 = winmd::reader::database::get_string(pdVar2,uVar3);
  this->name = sVar4;
  ptVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  pdVar2 = ptVar1->m_database;
  uVar3 = winmd::reader::table_base::get_value<unsigned_int>
                    (ptVar1,(type->super_row_base<winmd::reader::TypeDef>).m_index,2);
  sVar4 = winmd::reader::database::get_string(pdVar2,uVar3);
  this->name_space = sVar4;
  return;
}

Assistant:

explicit type_name(TypeDef const& type) :
            name(type.TypeName()),
            name_space(type.TypeNamespace())
        {
        }